

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

int Ssw_ClassesPrepareRehash(Ssw_Cla_t *p,Vec_Ptr_t *vCands,int fConstCorr)

{
  Aig_Obj_t *pRepr_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  Aig_Obj_t **ppNexts_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **pClass;
  int local_6c;
  int local_68;
  int nEntries2;
  int nEntries;
  int iEntry;
  int nNodes;
  int nTableSize;
  int k;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppClassNew;
  Aig_Obj_t **ppNexts;
  Aig_Obj_t **ppTable;
  int fConstCorr_local;
  Vec_Ptr_t *vCands_local;
  Ssw_Cla_t *p_local;
  
  iVar1 = Vec_PtrSize(vCands);
  uVar2 = Abc_PrimeCudd(iVar1 / 2);
  __ptr = calloc((long)(int)uVar2,8);
  iVar1 = Aig_ManObjNumMax(p->pAig);
  ppNexts_00 = (Aig_Obj_t **)calloc((long)iVar1,8);
  local_68 = 0;
  p->nCands1 = 0;
  for (nTableSize = 0; iVar1 = Vec_PtrSize(vCands), nTableSize < iVar1; nTableSize = nTableSize + 1)
  {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vCands,nTableSize);
    if (p->pClassSizes[pAVar4->Id] != 0) {
      __assert_fail("p->pClassSizes[pObj->Id] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                    ,0x205,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
    }
    Aig_ObjSetRepr(p->pAig,pAVar4,(Aig_Obj_t *)0x0);
    iVar1 = (*p->pFuncNodeIsConst)(p->pManData,pAVar4);
    if (iVar1 == 0) {
      if (fConstCorr == 0) {
        uVar3 = (*p->pFuncNodeHash)(p->pManData,pAVar4);
        uVar3 = uVar3 % uVar2;
        if (*(long *)((long)__ptr + (long)(int)uVar3 * 8) == 0) {
          *(Aig_Obj_t **)((long)__ptr + (long)(int)uVar3 * 8) = pAVar4;
        }
        else {
          pRepr_00 = *(Aig_Obj_t **)((long)__ptr + (long)(int)uVar3 * 8);
          Aig_ObjSetRepr(p->pAig,pAVar4,pRepr_00);
          pAVar5 = Ssw_ObjNext(ppNexts_00,pRepr_00);
          if (pAVar5 == (Aig_Obj_t *)0x0) {
            p->pClassSizes[pRepr_00->Id] = p->pClassSizes[pRepr_00->Id] + 1;
            local_68 = local_68 + 1;
          }
          pAVar5 = Ssw_ObjNext(ppNexts_00,pRepr_00);
          Ssw_ObjSetNext(ppNexts_00,pAVar4,pAVar5);
          Ssw_ObjSetNext(ppNexts_00,pRepr_00,pAVar4);
          p->pClassSizes[pRepr_00->Id] = p->pClassSizes[pRepr_00->Id] + 1;
          local_68 = local_68 + 1;
        }
      }
    }
    else {
      Ssw_ObjSetConst1Cand(p->pAig,pAVar4);
      p->nCands1 = p->nCands1 + 1;
    }
  }
  local_6c = 0;
  for (nTableSize = 0; iVar1 = Vec_PtrSize(vCands), nTableSize < iVar1; nTableSize = nTableSize + 1)
  {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vCands,nTableSize);
    iVar1 = p->pClassSizes[pAVar4->Id];
    if (iVar1 != 0) {
      if (iVar1 < 2) {
        __assert_fail("nNodes > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x232,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
      }
      pClass = p->pMemClassesFree + local_6c;
      *pClass = pAVar4;
      pRepr = Ssw_ObjNext(ppNexts_00,pAVar4);
      nNodes = 1;
      while (pRepr != (Aig_Obj_t *)0x0) {
        pClass[iVar1 - nNodes] = pRepr;
        pRepr = Ssw_ObjNext(ppNexts_00,pRepr);
        nNodes = nNodes + 1;
      }
      p->pClassSizes[pAVar4->Id] = 0;
      Ssw_ObjAddClass(p,pAVar4,pClass,iVar1);
      local_6c = iVar1 + local_6c;
    }
  }
  p->pMemClassesFree = p->pMemClassesFree + local_6c;
  if (local_68 == local_6c) {
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (ppNexts_00 != (Aig_Obj_t **)0x0) {
      free(ppNexts_00);
    }
    iVar1 = Ssw_ClassesRefine(p,1);
    return iVar1;
  }
  __assert_fail("nEntries == nEntries2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                ,0x242,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
}

Assistant:

int Ssw_ClassesPrepareRehash( Ssw_Cla_t * p, Vec_Ptr_t * vCands, int fConstCorr )
{
//    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Vec_PtrSize(vCands)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );

    // sort through the candidates
    nEntries = 0;
    p->nCands1 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        assert( p->pClassSizes[pObj->Id] == 0 );
        Aig_ObjSetRepr( p->pAig, pObj, NULL );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Ssw_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        if ( fConstCorr )
            continue;
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
        }
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Ssw_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Ssw_ObjSetNext( ppNexts, pObj, Ssw_ObjNext( ppNexts, pRepr ) );
            Ssw_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClassesFree + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Ssw_ObjNext(ppNexts, pObj), k = 1; pTemp;
              pTemp = Ssw_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Ssw_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    p->pMemClassesFree += nEntries2;
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    return Ssw_ClassesRefine( p, 1 );
}